

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O3

void printAddrMode2OffsetOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_struct *pcVar2;
  cs_detail *pcVar3;
  byte bVar4;
  char *pcVar5;
  uint uVar6;
  MCOperand *op;
  MCOperand *op_00;
  ulong uVar7;
  int64_t iVar8;
  undefined4 in_register_00000034;
  SStream *ss;
  char *pcVar9;
  
  ss = (SStream *)CONCAT44(in_register_00000034,OpNum);
  op = MCInst_getOperand(MI,3);
  op_00 = MCInst_getOperand(MI,4);
  uVar7 = MCOperand_getImm(op_00);
  uVar7 = uVar7 >> 0xc;
  bVar4 = (byte)uVar7 & 1;
  uVar6 = MCOperand_getReg(op);
  if (uVar6 != 0) {
    pcVar9 = "-";
    if ((uVar7 & 1) == 0) {
      pcVar9 = anon_var_dwarf_ee690 + 0x11;
    }
    SStream_concat0(ss,pcVar9);
    pcVar2 = MI->csh;
    uVar6 = MCOperand_getReg(op);
    pcVar9 = (*pcVar2->get_regname)(uVar6);
    SStream_concat0(ss,pcVar9);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar3 = MI->flat_insn->detail;
      puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar6 = MCOperand_getReg(op);
      pcVar3 = MI->flat_insn->detail;
      *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar6;
      pcVar3 = MI->flat_insn->detail;
      pcVar3->groups[(ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x56] = bVar4;
      puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
      *puVar1 = *puVar1 + '\x01';
    }
    uVar7 = MCOperand_getImm(op_00);
    iVar8 = MCOperand_getImm(op_00);
    printRegImmShift(MI,ss,(ARM_AM_ShiftOpc)(uVar7 >> 0xd) & (ARM_AM_ror|ARM_AM_lsr),
                     (uint)iVar8 & 0xfff);
    return;
  }
  iVar8 = MCOperand_getImm(op_00);
  uVar6 = (uint)iVar8 & 0xfff;
  pcVar9 = "-";
  if ((uVar7 & 1) == 0) {
    pcVar9 = anon_var_dwarf_ee690 + 0x11;
  }
  pcVar5 = ", #%s%u";
  if (9 < uVar6) {
    pcVar5 = ", #%s0x%x";
  }
  SStream_concat(ss,pcVar5 + 2,pcVar9,(ulong)uVar6);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar3 = MI->flat_insn->detail;
    *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar6;
    pcVar3 = MI->flat_insn->detail;
    pcVar3->groups[(ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x56] = bVar4;
    puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printAddrMode2OffsetOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	MCOperand *MO2 = MCInst_getOperand(MI, OpNum+1);
	ARM_AM_AddrOpc subtracted = getAM2Op((unsigned int)MCOperand_getImm(MO2));

	if (!MCOperand_getReg(MO1)) {
		unsigned ImmOffs = getAM2Offset((unsigned int)MCOperand_getImm(MO2));
		if (ImmOffs > HEX_THRESHOLD)
			SStream_concat(O, "#%s0x%x",
					ARM_AM_getAddrOpcStr(subtracted), ImmOffs);
		else
			SStream_concat(O, "#%s%u",
					ARM_AM_getAddrOpcStr(subtracted), ImmOffs);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = ImmOffs;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].subtracted = subtracted == ARM_AM_sub;
			MI->flat_insn->detail->arm.op_count++;
		}
		return;
	}

	SStream_concat0(O, ARM_AM_getAddrOpcStr(subtracted));
	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].subtracted = subtracted == ARM_AM_sub;
		MI->flat_insn->detail->arm.op_count++;
	}

	printRegImmShift(MI, O, getAM2ShiftOpc((unsigned int)MCOperand_getImm(MO2)),
			getAM2Offset((unsigned int)MCOperand_getImm(MO2)));
}